

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::ParseableFunctionInfo::Finalize(ParseableFunctionInfo *this,bool isShutdown)

{
  Utf8SourceInfo *this_00;
  LocalFunctionId functionID;
  
  if ((this->super_FunctionProxy).functionInfo.ptr != (FunctionInfo *)0x0) {
    this_00 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
    functionID = FunctionProxy::GetLocalFunctionId(&this->super_FunctionProxy);
    Utf8SourceInfo::StopTrackingDeferredFunction(this_00,functionID);
    return;
  }
  return;
}

Assistant:

void ParseableFunctionInfo::Finalize(bool isShutdown)
    {
        __super::Finalize(isShutdown);
        if (this->GetFunctionInfo())
        {
            // (If function info was never set, then initialization didn't finish, so there's nothing to remove from the dictionary.)
            this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
        }
        if (!this->m_hasBeenParsed)
        {
            PERF_COUNTER_DEC(Code, DeferredFunction);
        }
    }